

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O3

DWORD __thiscall
FNodeBuilder::CheckLoopStart(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex,int vertex2)

{
  FSimpleVert FVar1;
  int iVar2;
  FPrivVert *pFVar3;
  FPrivSeg *pFVar4;
  angle_t aVar5;
  angle_t aVar6;
  uint uVar7;
  uint uVar8;
  DWORD DVar9;
  uint uVar10;
  FPrivVert *pFVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double l;
  DWORD local_60;
  
  pFVar11 = (this->Vertices).Array;
  aVar5 = PointToAngle(dx,dy);
  uVar8 = pFVar11[vertex].segs2;
  if (uVar8 == 0xffffffff) {
    DVar9 = 0xffffffff;
  }
  else {
    pFVar11 = pFVar11 + vertex;
    dVar12 = (double)dy;
    dVar14 = (double)dx;
    uVar10 = 0xffffffff;
    local_60 = 0xffffffff;
    do {
      pFVar3 = (this->Vertices).Array;
      pFVar4 = (this->Segs).Array + uVar8;
      aVar6 = PointToAngle(pFVar3[pFVar4->v1].super_FSimpleVert.x - (pFVar11->super_FSimpleVert).x,
                           pFVar3[pFVar4->v1].super_FSimpleVert.y - (pFVar11->super_FSimpleVert).y);
      uVar7 = aVar5 - aVar6;
      if ((((4999 < uVar7) ||
           (FVar1 = (this->Vertices).Array[pFVar4->v1].super_FSimpleVert,
           dVar13 = ((double)(pFVar11->super_FSimpleVert).y - (double)FVar1.y) * dVar14 -
                    ((double)(pFVar11->super_FSimpleVert).x - (double)FVar1.x) * dVar12,
           17179869184.0 <= ABS(dVar13))) ||
          (42.94967296 <= (dVar13 * dVar13) / (dVar14 * dVar14 + dVar12 * dVar12))) &&
         (uVar7 <= uVar10)) {
        uVar10 = uVar7;
        local_60 = uVar8;
      }
      uVar8 = pFVar4->nextforvert2;
    } while (uVar8 != 0xffffffff);
    DVar9 = 0xffffffff;
    if (local_60 != 0xffffffff) {
      for (uVar8 = pFVar11->segs; DVar9 = local_60, uVar8 != 0xffffffff;
          uVar8 = pFVar4[uVar8].nextforvert) {
        pFVar4 = (this->Segs).Array;
        iVar2 = pFVar4[uVar8].v2;
        if (iVar2 == vertex2) {
          return 0xffffffff;
        }
        pFVar3 = (this->Vertices).Array;
        aVar6 = PointToAngle(pFVar3[iVar2].super_FSimpleVert.x - (pFVar11->super_FSimpleVert).x,
                             pFVar3[iVar2].super_FSimpleVert.y - (pFVar11->super_FSimpleVert).y);
        if ((aVar5 - aVar6 < uVar10) && (pFVar4[uVar8].partner != local_60)) {
          return 0xffffffff;
        }
      }
    }
  }
  return DVar9;
}

Assistant:

DWORD FNodeBuilder::CheckLoopStart (fixed_t dx, fixed_t dy, int vertex, int vertex2)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy);
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg ending at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs2;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = splitAngle - segAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert2;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs starting at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		if (seg->v2 == vertex2)
		{
			return DWORD_MAX;
		}
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = splitAngle - segAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert;
	}
	return bestseg;
}